

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void new_offset(File *fp,char *name)

{
  undefined8 *__s;
  size_t sVar1;
  OffsetEntry *entry;
  char *name_local;
  File *fp_local;
  
  __s = (undefined8 *)malloc(0x10);
  memset(__s,0,0x10);
  *__s = name;
  *(int *)((long)__s + 0xc) = (int)(fp->tables).cur - (int)(fp->tables).start;
  sVar1 = strlen(name);
  *(int *)(__s + 1) = (int)sVar1;
  set_add_fn(&fp->entries,__s,&offset_fns);
  return;
}

Assistant:

static void new_offset(File *fp, char *name) {
  OffsetEntry *entry = MALLOC(sizeof(OffsetEntry));
  memset(entry, 0, sizeof(OffsetEntry));
  entry->name = name;
  entry->offset = fp->tables.cur - fp->tables.start;
  entry->len = strlen(name);
  set_add_fn(&fp->entries, entry, &offset_fns);
}